

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ModuleManager.cpp
# Opt level: O0

void __thiscall luna::ModuleManager::LoadModule(ModuleManager *this,string *module_name)

{
  bool bVar1;
  undefined8 uVar2;
  State *this_00;
  String *str;
  Lexer *in_RDI;
  Value value;
  Value key;
  Lexer lexer;
  InStream is;
  string *in_stack_fffffffffffffee8;
  InStream *in_stack_fffffffffffffef0;
  Lexer *this_01;
  string *in_stack_fffffffffffffef8;
  State *in;
  State *in_stack_ffffffffffffff00;
  State *in_stack_ffffffffffffff08;
  Value local_c0;
  InStream *local_b0;
  String *in_stack_ffffffffffffff60;
  undefined8 in_stack_ffffffffffffff68;
  undefined8 in_stack_ffffffffffffff70;
  InStream local_18 [3];
  
  io::text::InStream::InStream(in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
  bVar1 = io::text::InStream::IsOpen(local_18);
  if (!bVar1) {
    uVar2 = __cxa_allocate_exception(0x20);
    OpenFileFail::OpenFileFail((OpenFileFail *)in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
    __cxa_throw(uVar2,&OpenFileFail::typeinfo,OpenFileFail::~OpenFileFail);
  }
  in = in_RDI->state_;
  this_00 = (State *)State::GetString(in_stack_ffffffffffffff00,(string *)in);
  local_b0 = local_18;
  this_01 = (Lexer *)&stack0xffffffffffffff58;
  std::function<int()>::
  function<luna::ModuleManager::LoadModule(std::__cxx11::string_const&)::__0,void>
            ((function<int_()> *)this_00,(anon_class_8_1_3fcf65e8 *)in);
  Lexer::Lexer(in_RDI,in_stack_ffffffffffffff08,(String *)this_00,(CharInStream *)in);
  std::function<int_()>::~function((function<int_()> *)0x1824af);
  Load((ModuleManager *)in_RDI,(Lexer *)in_stack_ffffffffffffff08);
  str = State::GetString(this_00,(string *)in);
  Value::Value(&local_c0,str);
  Table::SetValue((Table *)in_stack_ffffffffffffff70,(Value *)in_stack_ffffffffffffff68,
                  (Value *)in_stack_ffffffffffffff60);
  Lexer::~Lexer(this_01);
  io::text::InStream::~InStream((InStream *)this_01);
  return;
}

Assistant:

void ModuleManager::LoadModule(const std::string &module_name)
    {
        io::text::InStream is(module_name);
        if (!is.IsOpen())
            throw OpenFileFail(module_name);

        Lexer lexer(state_, state_->GetString(module_name),
                    [&is] () { return is.GetChar(); });
        Load(lexer);

        // Add to modules' table
        Value key(state_->GetString(module_name));
        Value value = *(state_->stack_.top_ - 1);
        modules_->SetValue(key, value);
    }